

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::F_formatter<spdlog::details::scoped_padder>::format
          (F_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  long lVar1;
  uint uVar2;
  size_t sVar3;
  char *__src;
  int iVar4;
  ulong uVar5;
  ptrdiff_t _Num;
  size_t __n;
  duration duration;
  ulong uVar6;
  scoped_padder p;
  scoped_padder sStack_78;
  format_int local_50;
  
  uVar6 = (msg->time).__d.__r % 1000000000;
  scoped_padder::scoped_padder(&sStack_78,9,&(this->super_flag_formatter).padinfo_,dest);
  lVar1 = 0x3f;
  if ((uVar6 | 1) != 0) {
    for (; (uVar6 | 1) >> lVar1 == 0; lVar1 = lVar1 + -1) {
    }
  }
  uVar2 = ((uint)lVar1 ^ 0xffffffc0) * 0x4d1 + 0x13911 >> 0xc;
  uVar2 = (uVar2 + 1) -
          (uint)(uVar6 < *(ulong *)(fmt::v6::internal::basic_data<void>::zero_or_powers_of_10_64 +
                                   (ulong)uVar2 * 8));
  if (uVar2 < 9) {
    iVar4 = 9 - uVar2;
    do {
      sVar3 = (dest->super_buffer<char>).size_;
      uVar5 = sVar3 + 1;
      if ((dest->super_buffer<char>).capacity_ < uVar5) {
        (**(dest->super_buffer<char>)._vptr_buffer)(dest);
        sVar3 = (dest->super_buffer<char>).size_;
        uVar5 = sVar3 + 1;
      }
      (dest->super_buffer<char>).size_ = uVar5;
      (dest->super_buffer<char>).ptr_[sVar3] = '0';
      iVar4 = iVar4 + -1;
    } while (iVar4 != 0);
  }
  __src = fmt::v6::format_int::format_decimal(&local_50,uVar6);
  __n = (long)(local_50.buffer_ + 0x15) - (long)__src;
  uVar6 = (dest->super_buffer<char>).size_ + __n;
  local_50.str_ = __src;
  if ((dest->super_buffer<char>).capacity_ < uVar6) {
    (**(dest->super_buffer<char>)._vptr_buffer)(dest,uVar6);
  }
  if (local_50.buffer_ + 0x15 != __src) {
    memmove((dest->super_buffer<char>).ptr_ + (dest->super_buffer<char>).size_,__src,__n);
  }
  (dest->super_buffer<char>).size_ = uVar6;
  scoped_padder::~scoped_padder(&sStack_78);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        auto ns = fmt_helper::time_fraction<std::chrono::nanoseconds>(msg.time);
        const size_t field_size = 9;
        ScopedPadder p(field_size, padinfo_, dest);
        fmt_helper::pad9(static_cast<size_t>(ns.count()), dest);
    }